

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersector1<4,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::ObjectIntersector1<false>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  Geometry *this;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 (*pauVar14) [16];
  byte bVar15;
  bool bVar16;
  bool bVar17;
  uint uVar18;
  undefined1 (*pauVar19) [16];
  ulong uVar20;
  ulong uVar21;
  byte bVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_fe8 [8];
  float fStack_fe0;
  float fStack_fdc;
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  long local_fb0;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    bVar16 = false;
  }
  else {
    uStack_f70 = 0;
    fVar1 = (context->query_radius).field_0.m128[0];
    auVar35 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_fd8 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar5 = (context->query_radius).field_0;
      local_fd8 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
    }
    pauVar19 = (undefined1 (*) [16])local_f68;
    uVar2 = *(undefined4 *)&(query->p).field_0;
    local_fc8._4_4_ = uVar2;
    local_fc8._0_4_ = uVar2;
    local_fc8._8_4_ = uVar2;
    local_fc8._12_4_ = uVar2;
    auVar34 = ZEXT1664(local_fc8);
    fVar3 = (query->p).field_0.field_0.y;
    auVar33._4_4_ = fVar3;
    auVar33._0_4_ = fVar3;
    auVar33._8_4_ = fVar3;
    auVar33._12_4_ = fVar3;
    fVar4 = (query->p).field_0.field_0.z;
    auVar32._4_4_ = fVar4;
    auVar32._0_4_ = fVar4;
    auVar32._8_4_ = fVar4;
    auVar32._12_4_ = fVar4;
    local_f98 = (context->query_radius).field_0.m128[1];
    fStack_f94 = local_f98;
    fStack_f90 = local_f98;
    fStack_f8c = local_f98;
    local_fa8 = (context->query_radius).field_0.m128[2];
    fStack_fa4 = local_fa8;
    fStack_fa0 = local_fa8;
    fStack_f9c = local_fa8;
    auVar24 = vshufps_avx(ZEXT416((uint)(fVar1 * fVar1)),ZEXT416((uint)(fVar1 * fVar1)),0);
    bVar16 = false;
    do {
      local_f88 = auVar35._0_16_;
      auVar11 = vsubps_avx(auVar34._0_16_,local_f88);
      auVar25._0_4_ = auVar34._0_4_ + auVar35._0_4_;
      auVar25._4_4_ = auVar34._4_4_ + auVar35._4_4_;
      auVar25._8_4_ = auVar34._8_4_ + auVar35._8_4_;
      auVar25._12_4_ = auVar34._12_4_ + auVar35._12_4_;
      auVar12._4_4_ = fStack_f94;
      auVar12._0_4_ = local_f98;
      auVar12._8_4_ = fStack_f90;
      auVar12._12_4_ = fStack_f8c;
      auVar12 = vsubps_avx(auVar33,auVar12);
      auVar26._0_4_ = fVar3 + local_f98;
      auVar26._4_4_ = fVar3 + fStack_f94;
      auVar26._8_4_ = fVar3 + fStack_f90;
      auVar26._12_4_ = fVar3 + fStack_f8c;
      auVar13._4_4_ = fStack_fa4;
      auVar13._0_4_ = local_fa8;
      auVar13._8_4_ = fStack_fa0;
      auVar13._12_4_ = fStack_f9c;
      auVar13 = vsubps_avx(auVar32,auVar13);
      auVar27._0_4_ = fVar4 + local_fa8;
      auVar27._4_4_ = fVar4 + fStack_fa4;
      auVar27._8_4_ = fVar4 + fStack_fa0;
      auVar27._12_4_ = fVar4 + fStack_f9c;
      while( true ) {
        pauVar14 = pauVar19 + -1;
        pauVar19 = pauVar19 + -1;
        if ((float)local_fd8._0_4_ < *(float *)(*pauVar14 + 8)) break;
        uVar20 = *(ulong *)*pauVar19;
LAB_011e8da7:
        auVar28 = auVar34._0_16_;
        if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
          if ((uVar20 & 8) != 0) {
LAB_011e90f3:
            local_fb0 = (ulong)((uint)uVar20 & 0xf) - 8;
            if (local_fb0 != 0) {
              lVar23 = 0;
              bVar15 = 0;
              do {
                bVar22 = bVar15;
                uVar18 = *(uint *)((uVar20 & 0xfffffffffffffff0) + lVar23 * 8);
                this = (context->scene->geometries).items[uVar18].ptr;
                context->geomID = uVar18;
                context->primID = *(uint *)((uVar20 & 0xfffffffffffffff0) + 4 + lVar23 * 8);
                bVar17 = Geometry::pointQuery(this,query,context);
                lVar23 = lVar23 + 1;
                bVar15 = bVar22 | bVar17;
              } while (local_fb0 != lVar23);
              if (bVar22 == 0 && !bVar17) {
                auVar35 = ZEXT1664(local_f88);
                auVar34 = ZEXT1664(local_fc8);
              }
              else {
                uVar2 = *(undefined4 *)&(context->query_radius).field_0;
                auVar35 = ZEXT1664(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))));
                local_f98 = (context->query_radius).field_0.m128[1];
                fStack_f94 = local_f98;
                fStack_f90 = local_f98;
                fStack_f8c = local_f98;
                local_fa8 = (context->query_radius).field_0.m128[2];
                fStack_fa4 = local_fa8;
                fStack_fa0 = local_fa8;
                fStack_f9c = local_fa8;
                auVar34 = ZEXT1664(local_fc8);
                if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
                  local_fd8 = ZEXT416((uint)(query->radius * query->radius));
                }
                else {
                  aVar5 = (context->query_radius).field_0;
                  local_fd8 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
                }
                bVar16 = true;
              }
            }
            break;
          }
          auVar29 = vmaxps_avx(auVar28,*(undefined1 (*) [16])(uVar20 + 0x20));
          auVar30 = vminps_avx(auVar29,*(undefined1 (*) [16])(uVar20 + 0x30));
          auVar29 = vmaxps_avx(auVar33,*(undefined1 (*) [16])(uVar20 + 0x40));
          auVar29 = vminps_avx(auVar29,*(undefined1 (*) [16])(uVar20 + 0x50));
          auVar30 = vsubps_avx(auVar30,auVar28);
          auVar29 = vsubps_avx(auVar29,auVar33);
          auVar28 = vmaxps_avx(auVar32,*(undefined1 (*) [16])(uVar20 + 0x60));
          auVar28 = vminps_avx(auVar28,*(undefined1 (*) [16])(uVar20 + 0x70));
          auVar28 = vsubps_avx(auVar28,auVar32);
          local_fe8._0_4_ =
               auVar30._0_4_ * auVar30._0_4_ + auVar29._0_4_ * auVar29._0_4_ +
               auVar28._0_4_ * auVar28._0_4_;
          local_fe8._4_4_ =
               auVar30._4_4_ * auVar30._4_4_ + auVar29._4_4_ * auVar29._4_4_ +
               auVar28._4_4_ * auVar28._4_4_;
          fStack_fe0 = auVar30._8_4_ * auVar30._8_4_ + auVar29._8_4_ * auVar29._8_4_ +
                       auVar28._8_4_ * auVar28._8_4_;
          fStack_fdc = auVar30._12_4_ * auVar30._12_4_ + auVar29._12_4_ * auVar29._12_4_ +
                       auVar28._12_4_ * auVar28._12_4_;
          auVar28 = vcmpps_avx(_local_fe8,auVar24,2);
          auVar29 = vcmpps_avx(*(undefined1 (*) [16])(uVar20 + 0x20),
                               *(undefined1 (*) [16])(uVar20 + 0x30),2);
          auVar28 = vandps_avx(auVar28,auVar29);
        }
        else {
          if ((uVar20 & 8) != 0) goto LAB_011e90f3;
          auVar29 = *(undefined1 (*) [16])(uVar20 + 0x20);
          auVar30 = *(undefined1 (*) [16])(uVar20 + 0x30);
          auVar9 = vmaxps_avx(auVar28,auVar29);
          auVar9 = vminps_avx(auVar9,auVar30);
          auVar9 = vsubps_avx(auVar9,auVar28);
          auVar28 = vmaxps_avx(auVar33,*(undefined1 (*) [16])(uVar20 + 0x40));
          auVar28 = vminps_avx(auVar28,*(undefined1 (*) [16])(uVar20 + 0x50));
          auVar31 = vsubps_avx(auVar28,auVar33);
          auVar28 = vmaxps_avx(auVar32,*(undefined1 (*) [16])(uVar20 + 0x60));
          auVar28 = vminps_avx(auVar28,*(undefined1 (*) [16])(uVar20 + 0x70));
          auVar28 = vsubps_avx(auVar28,auVar32);
          auVar34 = ZEXT1664(local_fc8);
          local_fe8._4_4_ =
               auVar9._4_4_ * auVar9._4_4_ + auVar31._4_4_ * auVar31._4_4_ +
               auVar28._4_4_ * auVar28._4_4_;
          local_fe8._0_4_ =
               auVar9._0_4_ * auVar9._0_4_ + auVar31._0_4_ * auVar31._0_4_ +
               auVar28._0_4_ * auVar28._0_4_;
          fStack_fe0 = auVar9._8_4_ * auVar9._8_4_ + auVar31._8_4_ * auVar31._8_4_ +
                       auVar28._8_4_ * auVar28._8_4_;
          fStack_fdc = auVar9._12_4_ * auVar9._12_4_ + auVar31._12_4_ * auVar31._12_4_ +
                       auVar28._12_4_ * auVar28._12_4_;
          auVar28 = vcmpps_avx(auVar29,auVar30,2);
          auVar9 = vcmpps_avx(*(undefined1 (*) [16])(uVar20 + 0x50),auVar12,5);
          auVar28 = vandps_avx(auVar28,auVar9);
          auVar29 = vcmpps_avx(auVar29,auVar25,2);
          auVar9 = vcmpps_avx(*(undefined1 (*) [16])(uVar20 + 0x40),auVar26,2);
          auVar29 = vandps_avx(auVar9,auVar29);
          auVar9 = vcmpps_avx(*(undefined1 (*) [16])(uVar20 + 0x70),auVar13,5);
          auVar28 = vandps_avx(auVar28,auVar9);
          auVar30 = vcmpps_avx(auVar30,auVar11,5);
          auVar9 = vcmpps_avx(*(undefined1 (*) [16])(uVar20 + 0x60),auVar27,2);
          auVar30 = vandps_avx(auVar30,auVar9);
          auVar29 = vandps_avx(auVar29,auVar30);
          auVar28 = vandps_avx(auVar28,auVar29);
        }
        auVar28 = vpslld_avx(auVar28,0x1f);
        uVar18 = vmovmskps_avx(auVar28);
        if (uVar18 != 0) {
          uVar18 = uVar18 & 0xff;
          uVar21 = uVar20 & 0xfffffffffffffff0;
          lVar23 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
            }
          }
          uVar20 = *(ulong *)(uVar21 + lVar23 * 8);
          uVar18 = uVar18 - 1 & uVar18;
          if (uVar18 != 0) {
            uVar6 = *(uint *)(local_fe8 + lVar23 * 4);
            lVar23 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
              }
            }
            uVar8 = *(ulong *)(uVar21 + lVar23 * 8);
            uVar7 = *(uint *)(local_fe8 + lVar23 * 4);
            uVar18 = uVar18 - 1 & uVar18;
            if (uVar18 == 0) {
              if (uVar6 < uVar7) {
                *(ulong *)*pauVar19 = uVar8;
                *(uint *)(*pauVar19 + 8) = uVar7;
                pauVar19 = pauVar19 + 1;
              }
              else {
                *(ulong *)*pauVar19 = uVar20;
                *(uint *)(*pauVar19 + 8) = uVar6;
                pauVar19 = pauVar19 + 1;
                uVar20 = uVar8;
              }
            }
            else {
              auVar28._8_8_ = 0;
              auVar28._0_8_ = uVar20;
              auVar28 = vpunpcklqdq_avx(auVar28,ZEXT416(uVar6));
              auVar29._8_8_ = 0;
              auVar29._0_8_ = uVar8;
              auVar29 = vpunpcklqdq_avx(auVar29,ZEXT416(uVar7));
              lVar23 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                }
              }
              auVar30._8_8_ = 0;
              auVar30._0_8_ = *(ulong *)(uVar21 + lVar23 * 8);
              auVar9 = vpunpcklqdq_avx(auVar30,ZEXT416(*(uint *)(local_fe8 + lVar23 * 4)));
              auVar30 = vpcmpgtd_avx(auVar29,auVar28);
              uVar18 = uVar18 - 1 & uVar18;
              if (uVar18 == 0) {
                auVar31 = vpshufd_avx(auVar30,0xaa);
                auVar30 = vblendvps_avx(auVar29,auVar28,auVar31);
                auVar28 = vblendvps_avx(auVar28,auVar29,auVar31);
                auVar29 = vpcmpgtd_avx(auVar9,auVar30);
                auVar31 = vpshufd_avx(auVar29,0xaa);
                auVar29 = vblendvps_avx(auVar9,auVar30,auVar31);
                auVar30 = vblendvps_avx(auVar30,auVar9,auVar31);
                auVar9 = vpcmpgtd_avx(auVar30,auVar28);
                auVar31 = vpshufd_avx(auVar9,0xaa);
                auVar9 = vblendvps_avx(auVar30,auVar28,auVar31);
                auVar28 = vblendvps_avx(auVar28,auVar30,auVar31);
                *pauVar19 = auVar28;
                pauVar19[1] = auVar9;
                uVar20 = auVar29._0_8_;
                pauVar19 = pauVar19 + 2;
              }
              else {
                lVar23 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                  }
                }
                auVar31._8_8_ = 0;
                auVar31._0_8_ = *(ulong *)(uVar21 + lVar23 * 8);
                auVar10 = vpunpcklqdq_avx(auVar31,ZEXT416(*(uint *)(local_fe8 + lVar23 * 4)));
                auVar31 = vpshufd_avx(auVar30,0xaa);
                auVar30 = vblendvps_avx(auVar29,auVar28,auVar31);
                auVar28 = vblendvps_avx(auVar28,auVar29,auVar31);
                auVar29 = vpcmpgtd_avx(auVar10,auVar9);
                auVar31 = vpshufd_avx(auVar29,0xaa);
                auVar29 = vblendvps_avx(auVar10,auVar9,auVar31);
                auVar9 = vblendvps_avx(auVar9,auVar10,auVar31);
                auVar31 = vpcmpgtd_avx(auVar9,auVar28);
                auVar10 = vpshufd_avx(auVar31,0xaa);
                auVar31 = vblendvps_avx(auVar9,auVar28,auVar10);
                auVar28 = vblendvps_avx(auVar28,auVar9,auVar10);
                auVar9 = vpcmpgtd_avx(auVar29,auVar30);
                auVar10 = vpshufd_avx(auVar9,0xaa);
                auVar9 = vblendvps_avx(auVar29,auVar30,auVar10);
                auVar29 = vblendvps_avx(auVar30,auVar29,auVar10);
                auVar30 = vpcmpgtd_avx(auVar31,auVar29);
                auVar10 = vpshufd_avx(auVar30,0xaa);
                auVar30 = vblendvps_avx(auVar31,auVar29,auVar10);
                auVar29 = vblendvps_avx(auVar29,auVar31,auVar10);
                *pauVar19 = auVar28;
                pauVar19[1] = auVar29;
                pauVar19[2] = auVar30;
                uVar20 = auVar9._0_8_;
                pauVar19 = pauVar19 + 3;
              }
            }
          }
          goto LAB_011e8da7;
        }
        if (pauVar19 == (undefined1 (*) [16])&local_f78) {
          return bVar16;
        }
      }
      auVar24._0_4_ = auVar35._0_4_ * auVar35._0_4_;
      auVar24._4_4_ = auVar35._4_4_ * auVar35._4_4_;
      auVar24._8_4_ = auVar35._8_4_ * auVar35._8_4_;
      auVar24._12_4_ = auVar35._12_4_ * auVar35._12_4_;
    } while (pauVar19 != (undefined1 (*) [16])&local_f78);
  }
  return bVar16;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }